

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

int __thiscall GdlGlyphClassDefn::ActualForPseudo(GdlGlyphClassDefn *this,utf16 wPseudo)

{
  pointer ppGVar1;
  GdlGlyphClassMember *pGVar2;
  uint uVar3;
  size_t ipglfd;
  ulong uVar4;
  
  uVar4 = 0;
  do {
    ppGVar1 = (this->m_vpglfdMembers).
              super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpglfdMembers).
                      super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar4) {
      return 0;
    }
    pGVar2 = ppGVar1[uVar4];
    uVar3 = (*(pGVar2->super_GdlDefn)._vptr_GdlDefn[4])(pGVar2,wPseudo);
    uVar4 = uVar4 + 1;
  } while ((uVar3 & 0xffff) == 0);
  return uVar3 & 0xffff;
}

Assistant:

int GdlGlyphClassDefn::ActualForPseudo(utf16 wPseudo)
{
	for (size_t ipglfd = 0; ipglfd < m_vpglfdMembers.size(); ipglfd++)
	{
		utf16 wActual = m_vpglfdMembers[ipglfd]->ActualForPseudo(wPseudo);
		if (wActual != 0)
			return wActual;
	}
	return 0;
}